

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

string * testing::internal::StringStreamToString(string *__return_storage_ptr__,stringstream *ss)

{
  long lVar1;
  char *pcVar2;
  char *local_70;
  char *ch;
  char *end;
  char *start;
  char **local_20;
  string *str;
  stringstream *ss_local;
  string *result;
  
  str = (string *)ss;
  ss_local = (stringstream *)__return_storage_ptr__;
  std::__cxx11::stringstream::str();
  local_20 = &start;
  local_70 = (char *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::length();
  pcVar2 = local_70 + lVar1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (; local_70 != pcVar2; local_70 = local_70 + 1) {
    if (*local_70 == '\0') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\0");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_70);
    }
  }
  std::__cxx11::string::~string((string *)&start);
  return __return_storage_ptr__;
}

Assistant:

std::string StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  std::string result;
  result.reserve(2 * (end - start));
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      result += "\\0";  // Replaces NUL with "\\0";
    } else {
      result += *ch;
    }
  }

  return result;
}